

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void A_OverlayOffset(AActor *self,int layer,double wx,double wy,int flags)

{
  player_t *this;
  DPSprite *pDVar1;
  DPSprite *psp;
  player_t *player;
  int flags_local;
  double wy_local;
  double wx_local;
  int layer_local;
  AActor *self_local;
  
  if (((((flags & 1U) == 0) || ((flags & 2U) == 0)) &&
      (this = self->player, this != (player_t *)0x0)) &&
     ((this->playerstate != '\x01' &&
      (pDVar1 = player_t::FindPSprite(this,layer), pDVar1 != (DPSprite *)0x0)))) {
    if ((flags & 1U) == 0) {
      if ((flags & 4U) == 0) {
        pDVar1->x = wx;
      }
      else {
        pDVar1->x = wx + pDVar1->x;
      }
    }
    if ((flags & 2U) == 0) {
      if ((flags & 4U) == 0) {
        pDVar1->y = wy;
      }
      else {
        pDVar1->y = wy + pDVar1->y;
      }
    }
  }
  return;
}

Assistant:

void A_OverlayOffset(AActor *self, int layer, double wx, double wy, int flags)
{
	if ((flags & WOF_KEEPX) && (flags & WOF_KEEPY))
	{
		return;
	}

	player_t *player = self->player;
	DPSprite *psp;

	if (player && (player->playerstate != PST_DEAD))
	{
		psp = player->FindPSprite(layer);

		if (psp == nullptr)
			return;

		if (!(flags & WOF_KEEPX))
		{
			if (flags & WOF_ADD)
			{
				psp->x += wx;
			}
			else
			{
				psp->x = wx;
			}
		}
		if (!(flags & WOF_KEEPY))
		{
			if (flags & WOF_ADD)
			{
				psp->y += wy;
			}
			else
			{
				psp->y = wy;
			}
		}
	}
}